

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::display(GlxContext *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      (*sf_glad_glXSwapBuffers)(*(Display **)(in_RDI + 0x30),*(GLXDrawable *)(in_RDI + 0x38));
    }
  }
  else {
    (*sf_glad_glXSwapBuffers)(*(Display **)(in_RDI + 0x30),*(GLXDrawable *)(in_RDI + 0x48));
  }
  return;
}

Assistant:

void GlxContext::display()
{
#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

    if (m_pbuffer)
        glXSwapBuffers(m_display, m_pbuffer);
    else if (m_window)
        glXSwapBuffers(m_display, m_window);

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::display()" << std::endl;
#endif
}